

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_ref_t art_node16_erase(art_t *art,art_node16_t *node,uint8_t key_chunk)

{
  art_node4_t *node_00;
  char in_DL;
  art_t *in_RSI;
  size_t i_1;
  art_node4_t *new_node;
  size_t after_next;
  size_t i;
  art_node_t *in_stack_ffffffffffffffb8;
  art_t *in_stack_ffffffffffffffc0;
  art_t *art_00;
  art_key_chunk_t *in_stack_ffffffffffffffc8;
  art_t *in_stack_ffffffffffffffd0;
  ulong child;
  undefined7 in_stack_ffffffffffffffe0;
  art_ref_t local_8;
  
  child = 0;
  do {
    if (*(byte *)((long)&in_RSI->root + 6) <= child) {
LAB_00112066:
      if (*(byte *)((long)&in_RSI->root + 6) < 5) {
        node_00 = art_node4_create(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                                   (uint8_t)((ulong)in_stack_ffffffffffffffc0 >> 0x38));
        for (art_00 = (art_t *)0x0; art_00 < (art_t *)0x4;
            art_00 = (art_t *)((long)&art_00->root + 1)) {
          art_node4_insert(in_RSI,(art_node4_t *)CONCAT17(in_DL,in_stack_ffffffffffffffe0),child,
                           (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38));
        }
        art_node_free(in_stack_ffffffffffffffd0,node_00,(art_typecode_t)((ulong)art_00 >> 0x38));
        local_8 = art_get_ref(art_00,in_stack_ffffffffffffffb8,'\0');
      }
      else {
        local_8 = art_get_ref(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,'\0');
      }
      return local_8;
    }
    if (*(char *)((long)in_RSI->first_free + (child - 1)) == in_DL) {
      in_stack_ffffffffffffffd0 = (art_t *)((*(byte *)((long)&in_RSI->root + 6) - child) - 1);
      memmove((void *)((long)in_RSI->first_free + (child - 1)),
              (void *)((long)in_RSI->first_free + child),(size_t)in_stack_ffffffffffffffd0);
      memmove(in_RSI->first_free + child + 2,in_RSI->first_free + child + 3,
              (long)in_stack_ffffffffffffffd0 << 3);
      *(char *)((long)&in_RSI->root + 6) = *(char *)((long)&in_RSI->root + 6) + -1;
      goto LAB_00112066;
    }
    child = child + 1;
  } while( true );
}

Assistant:

static inline art_ref_t art_node16_erase(art_t *art, art_node16_t *node,
                                         uint8_t key_chunk) {
    for (size_t i = 0; i < node->count; ++i) {
        if (node->keys[i] == key_chunk) {
            // Shift other keys to maintain sorted order.
            size_t after_next = node->count - i - 1;
            memmove(node->keys + i, node->keys + i + 1,
                    after_next * sizeof(key_chunk));
            memmove(node->children + i, node->children + i + 1,
                    after_next * sizeof(art_ref_t));
            node->count--;
            break;
        }
    }
    if (node->count > 4) {
        return art_get_ref(art, (art_node_t *)node, CROARING_ART_NODE16_TYPE);
    }
    art_node4_t *new_node =
        art_node4_create(art, node->base.prefix, node->base.prefix_size);
    // Instead of calling insert, this could be specialized to 2x memcpy and
    // setting the count.
    for (size_t i = 0; i < 4; ++i) {
        art_node4_insert(art, new_node, node->children[i], node->keys[i]);
    }
    art_node_free(art, (art_node_t *)node, CROARING_ART_NODE16_TYPE);
    return art_get_ref(art, (art_node_t *)new_node, CROARING_ART_NODE4_TYPE);
}